

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVF.cpp
# Opt level: O0

void __thiscall MT32Emu::TVF::startDecay(TVF *this)

{
  TVF *this_local;
  
  if (this->phase < 6) {
    if ((this->partialParam->tvf).envTime[4] == '\0') {
      startRamp(this,'\0','\x01',6);
    }
    else {
      startRamp(this,'\0',-(this->partialParam->tvf).envTime[4],6);
    }
  }
  return;
}

Assistant:

void TVF::startDecay() {
	if (phase >= PHASE_RELEASE) {
		return;
	}
	if (partialParam->tvf.envTime[4] == 0) {
		startRamp(0, 1, PHASE_DONE - 1);
	} else {
		startRamp(0, -partialParam->tvf.envTime[4], PHASE_DONE - 1);
	}
}